

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IObject.h
# Opt level: O1

void __thiscall IObject::GetInterface(IObject *this,InterfaceID iid,void **pReturn)

{
  IObject *pIVar1;
  
  pIVar1 = (IObject *)0x0;
  if (iid == 0) {
    pIVar1 = this;
  }
  *pReturn = pIVar1;
  return;
}

Assistant:

virtual void GetInterface( InterfaceID iid, void** pReturn )
	{
		switch( iid )
		{
		case IID_IOBJECT:
			*pReturn = this;
			break;
		default:
			*pReturn = NULL;
		}
	}